

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OpenTableAndIndices
              (Parse *pParse,Table *pTab,int op,u8 p5,int iBase,u8 *aToOpen,int *piDataCur,
              int *piIdxCur)

{
  int iDb_00;
  byte in_CL;
  int iVar1;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  Parse *in_R9;
  int iIdxCur;
  Vdbe *v;
  Index *pIdx;
  int iDataCur;
  int iDb;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Vdbe *p;
  undefined1 *puVar2;
  int iDb_01;
  Index *pIdx_00;
  int in_stack_ffffffffffffffc0;
  int iVar3;
  int local_24;
  byte local_1d;
  int local_4;
  
  iVar3 = -0x55555556;
  puVar2 = &DAT_aaaaaaaaaaaaaaaa;
  if (*(char *)(in_RSI + 0x3f) == '\x01') {
    *(undefined4 *)&pIdx->zName = 0xfffffc19;
    *(undefined4 *)&v->db = 0xfffffc19;
    local_4 = 0;
  }
  else {
    iDb_00 = sqlite3SchemaToIndex((sqlite3 *)*in_RDI,*(Schema **)(in_RSI + 0x60));
    p = (Vdbe *)in_RDI[2];
    local_24 = in_R8D;
    if (in_R8D < 0) {
      local_24 = (int)in_RDI[7];
    }
    iVar1 = local_24 + 1;
    *(int *)&v->db = local_24;
    iDb_01 = (int)((ulong)puVar2 >> 0x20);
    if (((*(uint *)(in_RSI + 0x30) & 0x80) == 0) &&
       ((in_R9 == (Parse *)0x0 || (*(char *)&in_R9->db != '\0')))) {
      sqlite3OpenTable(in_R9,iVar3,iDb_00,(Table *)CONCAT44(local_24,in_stack_ffffffffffffffc0),
                       iDb_01);
      iVar3 = local_24;
    }
    else {
      iVar3 = local_24;
      if (*(char *)(*in_RDI + 0x6f) == '\0') {
        sqlite3TableLock((Parse *)CONCAT44(local_24,in_stack_ffffffffffffffc0),iDb_01,(Pgno)puVar2,
                         (u8)((ulong)p >> 0x38),
                         (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        iVar3 = local_24;
      }
    }
    *(int *)&pIdx->zName = iVar1;
    local_4 = 0;
    local_24 = iVar1;
    local_1d = in_CL;
    for (pIdx_00 = *(Index **)(in_RSI + 0x10); pIdx_00 != (Index *)0x0; pIdx_00 = pIdx_00->pNext) {
      if (((*(ushort *)&pIdx_00->field_0x63 & 3) == 2) && ((*(uint *)(in_RSI + 0x30) & 0x80) != 0))
      {
        *(int *)&v->db = local_24;
        local_1d = 0;
      }
      if ((in_R9 == (Parse *)0x0) || (*(char *)((long)&in_R9->db + (long)(local_4 + 1)) != '\0')) {
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(local_4,iDb_00),iVar3,in_stack_ffffffffffffffc0,
                          (int)((ulong)pIdx_00 >> 0x20),(int)pIdx_00);
        sqlite3VdbeSetP4KeyInfo((Parse *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),pIdx_00);
        sqlite3VdbeChangeP5(p,(ushort)local_1d);
      }
      local_4 = local_4 + 1;
      local_24 = local_24 + 1;
    }
    if ((int)in_RDI[7] < local_24) {
      *(int *)(in_RDI + 7) = local_24;
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int op,          /* OP_OpenRead or OP_OpenWrite */
  u8 p5,           /* P5 value for OP_Open* opcodes (except on WITHOUT ROWID) */
  int iBase,       /* Use this for the table cursor, if there is one */
  u8 *aToOpen,     /* If not NULL: boolean for each table and index */
  int *piDataCur,  /* Write the database source cursor number here */
  int *piIdxCur    /* Write the first index cursor number here */
){
  int i;
  int iDb;
  int iDataCur;
  Index *pIdx;
  Vdbe *v;

  assert( op==OP_OpenRead || op==OP_OpenWrite );
  assert( op==OP_OpenWrite || p5==0 );
  assert( piDataCur!=0 );
  assert( piIdxCur!=0 );
  if( IsVirtual(pTab) ){
    /* This routine is a no-op for virtual tables. Leave the output
    ** variables *piDataCur and *piIdxCur set to illegal cursor numbers
    ** for improved error detection. */
    *piDataCur = *piIdxCur = -999;
    return 0;
  }
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = pParse->pVdbe;
  assert( v!=0 );
  if( iBase<0 ) iBase = pParse->nTab;
  iDataCur = iBase++;
  *piDataCur = iDataCur;
  if( HasRowid(pTab) && (aToOpen==0 || aToOpen[0]) ){
    sqlite3OpenTable(pParse, iDataCur, iDb, pTab, op);
  }else if( pParse->db->noSharedCache==0 ){
    sqlite3TableLock(pParse, iDb, pTab->tnum, op==OP_OpenWrite, pTab->zName);
  }
  *piIdxCur = iBase;
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    int iIdxCur = iBase++;
    assert( pIdx->pSchema==pTab->pSchema );
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      *piDataCur = iIdxCur;
      p5 = 0;
    }
    if( aToOpen==0 || aToOpen[i+1] ){
      sqlite3VdbeAddOp3(v, op, iIdxCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      sqlite3VdbeChangeP5(v, p5);
      VdbeComment((v, "%s", pIdx->zName));
    }
  }
  if( iBase>pParse->nTab ) pParse->nTab = iBase;
  return i;
}